

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

void Gia_ManFindChains(Gia_Man_t *p,Vec_Int_t *vFadds,Vec_Int_t *vMap)

{
  int iMaj;
  Vec_Int_t *p_00;
  int i;
  int iVar1;
  
  p_00 = Vec_IntStartFull(p->nObjs);
  i = 4;
  for (iVar1 = 0; iVar1 < vFadds->nSize / 5; iVar1 = iVar1 + 1) {
    iMaj = Vec_IntEntry(vFadds,i);
    Gia_ManFindChains_rec(p,iMaj,vFadds,vMap,p_00);
    i = i + 5;
  }
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Gia_ManFindChains( Gia_Man_t * p, Vec_Int_t * vFadds, Vec_Int_t * vMap )
{
    int i;
    // for each FADD find the longest chain rooted in it
    Vec_Int_t * vLength = Vec_IntStartFull( Gia_ManObjNum(p) );
    Dtc_ForEachFadd( vFadds, i )
        Gia_ManFindChains_rec( p, Vec_IntEntry(vFadds, 5*i+4), vFadds, vMap, vLength );
    Vec_IntFree( vLength );
}